

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_streams.c
# Opt level: O0

HPDF_STATUS HPDF_MemStream_InWrite(HPDF_Stream stream,HPDF_BYTE **ptr,HPDF_UINT *count)

{
  undefined8 *puVar1;
  uint n;
  void *pvVar2;
  HPDF_STATUS HVar3;
  HPDF_UINT rsize;
  HPDF_MemStreamAttr attr;
  HPDF_UINT *count_local;
  HPDF_BYTE **ptr_local;
  HPDF_Stream stream_local;
  
  puVar1 = (undefined8 *)stream->attr;
  n = *(int *)(puVar1 + 1) - *(int *)((long)puVar1 + 0xc);
  if (*count == 0) {
    return 0;
  }
  if (n < *count) {
    if (n != 0) {
      HPDF_MemCpy((HPDF_BYTE *)puVar1[2],*ptr,n);
      *ptr = *ptr + n;
      *count = *count - n;
    }
    pvVar2 = HPDF_GetMem(stream->mmgr,*(HPDF_UINT *)(puVar1 + 1));
    puVar1[2] = pvVar2;
    if (puVar1[2] == 0) {
      HVar3 = HPDF_Error_GetCode(stream->error);
      return HVar3;
    }
    HVar3 = HPDF_List_Add((HPDF_List)*puVar1,(void *)puVar1[2]);
    if (HVar3 != 0) {
      HPDF_FreeMem(stream->mmgr,(void *)puVar1[2]);
      puVar1[2] = 0;
      HVar3 = HPDF_Error_GetCode(stream->error);
      return HVar3;
    }
    *(undefined4 *)((long)puVar1 + 0xc) = 0;
  }
  else {
    HPDF_MemCpy((HPDF_BYTE *)puVar1[2],*ptr,*count);
    puVar1[2] = puVar1[2] + (ulong)*count;
    *(HPDF_UINT *)((long)puVar1 + 0xc) = *count + *(int *)((long)puVar1 + 0xc);
    *count = 0;
  }
  return 0;
}

Assistant:

HPDF_STATUS
HPDF_MemStream_InWrite  (HPDF_Stream      stream,
                         const HPDF_BYTE  **ptr,
                         HPDF_UINT        *count)
{
    HPDF_MemStreamAttr attr = (HPDF_MemStreamAttr)stream->attr;
    HPDF_UINT rsize = attr->buf_siz - attr->w_pos;

    HPDF_PTRACE((" HPDF_MemStream_InWrite\n"));

    if (*count <= 0)
        return HPDF_OK;

    if (rsize >= *count) {
        HPDF_MemCpy (attr->w_ptr, *ptr, *count);
        attr->w_ptr += *count;
        attr->w_pos += *count;
        *count = 0;
    } else {
        if (rsize > 0) {
            HPDF_MemCpy (attr->w_ptr, *ptr, rsize);
            *ptr += rsize;
            *count -= rsize;
        }
        attr->w_ptr = (HPDF_BYTE*)HPDF_GetMem (stream->mmgr, attr->buf_siz);

        if (attr->w_ptr == NULL)
           return HPDF_Error_GetCode (stream->error);

        if (HPDF_List_Add (attr->buf, attr->w_ptr) != HPDF_OK) {
            HPDF_FreeMem (stream->mmgr, attr->w_ptr);
            attr->w_ptr = NULL;

            return HPDF_Error_GetCode (stream->error);
        }
        attr->w_pos = 0;
    }
    return HPDF_OK;
}